

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O2

void __thiscall
capnp::compiler::CapnpParser::CapnpParser
          (CapnpParser *this,Orphanage orphanageParam,ErrorReporter *errorReporterParam)

{
  Arena *this_00;
  Parsers *__s;
  Parser<Orphan<Expression>_> *pPVar1;
  Parser<Orphan<Declaration::AnnotationApplication>_> *pPVar2;
  Parser<Orphan<LocatedInteger>_> *pPVar3;
  Parser<Orphan<LocatedInteger>_> *pPVar4;
  ErrorReporter *pEVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  long *plVar8;
  long *plVar9;
  OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>
  *pOVar10;
  long *plVar11;
  OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>
  *pOVar12;
  OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>
  *pOVar13;
  OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>
  *pOVar14;
  OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>
  local_68;
  
  (this->orphanage).arena = orphanageParam.arena;
  (this->orphanage).capTable = orphanageParam.capTable;
  this->errorReporter = errorReporterParam;
  this_00 = &this->arena;
  kj::Arena::Arena(this_00,0x400);
  __s = &this->parsers;
  memset(__s,0,0x160);
  puVar6 = (undefined8 *)kj::Arena::allocateBytes(this_00,0x38,8,false);
  pPVar1 = &(this->parsers).expression;
  *puVar6 = (anonymous_namespace)::identifier;
  puVar6[1] = (anonymous_namespace)::operatorToken;
  puVar6[2] = "=";
  puVar6[4] = pPVar1;
  puVar6[6] = this;
  pEVar5 = this->errorReporter;
  puVar7 = (undefined8 *)kj::Arena::allocateBytes(this_00,0x30,8,false);
  *puVar7 = (anonymous_namespace)::rawParenthesizedList;
  puVar7[1] = puVar6;
  puVar7[2] = &kj::parse::endOfInput;
  puVar7[4] = pEVar5;
  puVar7[5] = this;
  puVar6 = (undefined8 *)kj::Arena::allocateBytes(this_00,0x10,8,false);
  *puVar6 = puVar7;
  puVar6[1] = &kj::parse::
               ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::(anonymous_namespace)::Located<capnp::Orphan<capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>_>_>_>
               ::
               WrapperImplInstance<kj::parse::Transform_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/parser.c++:360:7)>_&>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/parser.c++:376:9)>_>
               ::instance;
  pEVar5 = this->errorReporter;
  puVar7 = (undefined8 *)kj::Arena::allocateBytes(this_00,0x1e0,8,false);
  *puVar7 = (anonymous_namespace)::integerLiteral;
  puVar7[1] = this;
  puVar7[2] = (anonymous_namespace)::operatorToken;
  puVar7[3] = "-";
  puVar7[4] = (anonymous_namespace)::integerLiteral;
  puVar7[6] = this;
  puVar7[7] = (anonymous_namespace)::floatLiteral;
  puVar7[8] = this;
  puVar7[9] = (anonymous_namespace)::operatorToken;
  puVar7[10] = "-";
  puVar7[0xb] = (anonymous_namespace)::floatLiteral;
  puVar7[0xd] = this;
  puVar7[0xe] = (anonymous_namespace)::operatorToken;
  puVar7[0xf] = "-";
  puVar7[0x10] = (anonymous_namespace)::identifier;
  puVar7[0x11] = "inf";
  puVar7[0x13] = this;
  puVar7[0x14] = (anonymous_namespace)::stringLiteral;
  puVar7[0x15] = this;
  puVar7[0x16] = (anonymous_namespace)::binaryLiteral;
  puVar7[0x17] = this;
  puVar7[0x18] = (anonymous_namespace)::rawBracketedList;
  puVar7[0x19] = pPVar1;
  puVar7[0x1a] = &kj::parse::endOfInput;
  puVar7[0x1c] = pEVar5;
  puVar7[0x1d] = this;
  puVar7[0x1e] = puVar6;
  puVar7[0x1f] = this;
  puVar7[0x20] = (anonymous_namespace)::identifier;
  puVar7[0x21] = "import";
  puVar7[0x22] = (anonymous_namespace)::stringLiteral;
  puVar7[0x24] = this;
  puVar7[0x25] = (anonymous_namespace)::identifier;
  puVar7[0x26] = "embed";
  puVar7[0x27] = (anonymous_namespace)::stringLiteral;
  puVar7[0x29] = this;
  puVar7[0x2a] = (anonymous_namespace)::operatorToken;
  puVar7[0x2b] = ".";
  puVar7[0x2c] = (anonymous_namespace)::identifier;
  puVar7[0x2e] = this;
  puVar7[0x2f] = (anonymous_namespace)::identifier;
  puVar7[0x30] = this;
  puVar7[0x32] = (anonymous_namespace)::operatorToken;
  puVar7[0x33] = ".";
  puVar7[0x34] = (anonymous_namespace)::identifier;
  puVar7[0x36] = this;
  puVar7[0x37] = puVar6;
  puVar7[0x38] = this;
  (this->parsers).expression.parser = puVar7;
  (this->parsers).expression.wrapper =
       &kj::parse::
        ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>
        ::WrapperImplInstance<$f1c87619$>::instance.super_Wrapper;
  puVar6 = (undefined8 *)kj::Arena::allocateBytes(this_00,0x28,8,false);
  *puVar6 = (anonymous_namespace)::operatorToken;
  puVar6[1] = "$";
  puVar6[2] = pPVar1;
  puVar6[4] = this;
  (this->parsers).annotation.parser = puVar6;
  (this->parsers).annotation.wrapper =
       &kj::parse::
        ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>
        ::
        WrapperImplInstance<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/parser.c++:558:7)>_>
        ::instance.super_Wrapper;
  puVar6 = (undefined8 *)kj::Arena::allocateBytes(this_00,0x28,8,false);
  *puVar6 = (anonymous_namespace)::operatorToken;
  puVar6[1] = "@";
  puVar6[2] = (anonymous_namespace)::integerLiteral;
  puVar6[4] = this;
  (this->parsers).uid.parser = puVar6;
  (this->parsers).uid.wrapper =
       &kj::parse::
        ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>
        ::
        WrapperImplInstance<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/parser.c++:589:7)>_>
        ::instance.super_Wrapper;
  puVar6 = (undefined8 *)kj::Arena::allocateBytes(this_00,0x28,8,false);
  *puVar6 = (anonymous_namespace)::operatorToken;
  puVar6[1] = "@";
  puVar6[2] = (anonymous_namespace)::integerLiteral;
  puVar6[4] = this;
  (this->parsers).ordinal.parser = puVar6;
  (this->parsers).ordinal.wrapper =
       &kj::parse::
        ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>
        ::
        WrapperImplInstance<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/parser.c++:599:7)>_>
        ::instance.super_Wrapper;
  puVar6 = (undefined8 *)kj::Arena::allocateBytes(this_00,0x48,8,false);
  *puVar6 = (anonymous_namespace)::identifier;
  puVar6[1] = "using";
  puVar6[2] = (anonymous_namespace)::identifier;
  puVar6[3] = (anonymous_namespace)::operatorToken;
  puVar6[4] = "=";
  puVar6[6] = pPVar1;
  puVar6[8] = this;
  (this->parsers).usingDecl.parser = puVar6;
  (this->parsers).usingDecl.wrapper =
       &kj::parse::
        ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
        ::
        WrapperImplInstance<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/parser.c++:612:7)>_>
        ::instance.super_Wrapper;
  puVar6 = (undefined8 *)kj::Arena::allocateBytes(this_00,0x68,8,false);
  pPVar2 = &(this->parsers).annotation;
  pPVar3 = &(this->parsers).uid;
  *puVar6 = (anonymous_namespace)::identifier;
  puVar6[1] = "const";
  puVar6[2] = (anonymous_namespace)::identifier;
  puVar6[3] = pPVar3;
  puVar6[4] = (anonymous_namespace)::operatorToken;
  puVar6[5] = ":";
  puVar6[6] = pPVar1;
  puVar6[7] = (anonymous_namespace)::operatorToken;
  puVar6[8] = "=";
  puVar6[9] = pPVar1;
  puVar6[10] = pPVar2;
  puVar6[0xc] = this;
  (this->parsers).constDecl.parser = puVar6;
  (this->parsers).constDecl.wrapper =
       &kj::parse::
        ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
        ::WrapperImplInstance<$15f5ded6$>::instance.super_Wrapper;
  puVar6 = (undefined8 *)kj::Arena::allocateBytes(this_00,0x38,8,false);
  *puVar6 = (anonymous_namespace)::identifier;
  puVar6[1] = "enum";
  puVar6[2] = (anonymous_namespace)::identifier;
  puVar6[3] = pPVar3;
  puVar6[4] = pPVar2;
  puVar6[6] = this;
  (this->parsers).enumDecl.parser = puVar6;
  (this->parsers).enumDecl.wrapper =
       &kj::parse::
        ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
        ::
        WrapperImplInstance<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&>,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/parser.c++:654:7)>_>
        ::instance.super_Wrapper;
  puVar6 = (undefined8 *)kj::Arena::allocateBytes(this_00,0x28,8,false);
  pPVar4 = &(this->parsers).ordinal;
  *puVar6 = (anonymous_namespace)::identifier;
  puVar6[1] = pPVar4;
  puVar6[2] = pPVar2;
  puVar6[4] = this;
  (this->parsers).enumerantDecl.parser = puVar6;
  (this->parsers).enumerantDecl.wrapper =
       &kj::parse::
        ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
        ::
        WrapperImplInstance<kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/parser.c++:664:7)>_>
        ::instance.super_Wrapper;
  pEVar5 = this->errorReporter;
  puVar6 = (undefined8 *)kj::Arena::allocateBytes(this_00,0x60,8,false);
  *puVar6 = (anonymous_namespace)::identifier;
  puVar6[1] = "struct";
  puVar6[2] = (anonymous_namespace)::identifier;
  puVar6[3] = pPVar3;
  puVar6[4] = (anonymous_namespace)::rawParenthesizedList;
  puVar6[5] = (anonymous_namespace)::identifier;
  puVar6[6] = &kj::parse::endOfInput;
  puVar6[8] = pEVar5;
  puVar6[9] = pPVar2;
  puVar6[0xb] = this;
  (this->parsers).structDecl.parser = puVar6;
  (this->parsers).structDecl.wrapper =
       &kj::parse::
        ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
        ::
        WrapperImplInstance<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&>,_kj::parse::Optional_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>_>_>,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/parser.c++:677:7)>_>
        ::instance.super_Wrapper;
  puVar6 = (undefined8 *)kj::Arena::allocateBytes(this_00,0x60,8,false);
  *puVar6 = (anonymous_namespace)::identifier;
  puVar6[1] = pPVar4;
  puVar6[2] = (anonymous_namespace)::operatorToken;
  puVar6[3] = ":";
  puVar6[4] = pPVar1;
  puVar6[5] = (anonymous_namespace)::operatorToken;
  puVar6[6] = "=";
  puVar6[7] = pPVar1;
  puVar6[9] = pPVar2;
  puVar6[0xb] = this;
  (this->parsers).fieldDecl.parser = puVar6;
  (this->parsers).fieldDecl.wrapper =
       &kj::parse::
        ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
        ::WrapperImplInstance<$59213f86$>::instance.super_Wrapper;
  plVar8 = (long *)kj::Arena::allocateBytes(this_00,0x58,8,false);
  *plVar8 = (long)pPVar4;
  plVar8[1] = (long)(anonymous_namespace)::operatorToken;
  plVar8[2] = (long)"!";
  plVar8[3] = (long)(anonymous_namespace)::operatorToken;
  plVar8[4] = (long)":";
  plVar8[7] = (long)(anonymous_namespace)::operatorToken;
  plVar8[8] = (long)":";
  puVar6 = (undefined8 *)kj::Arena::allocateBytes(this_00,0x68,8,false);
  *puVar6 = (anonymous_namespace)::identifier;
  puVar6[1] = plVar8;
  puVar6[2] = (anonymous_namespace)::identifier;
  puVar6[3] = "union";
  puVar6[4] = pPVar2;
  puVar6[6] = (anonymous_namespace)::identifier;
  puVar6[7] = "union";
  puVar6[8] = &kj::parse::endOfInput;
  puVar6[0xc] = this;
  (this->parsers).unionDecl.parser = puVar6;
  (this->parsers).unionDecl.wrapper =
       &kj::parse::
        ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
        ::WrapperImplInstance<$33e85fdf$>::instance.super_Wrapper;
  puVar6 = (undefined8 *)kj::Arena::allocateBytes(this_00,0x40,8,false);
  *puVar6 = (anonymous_namespace)::identifier;
  puVar6[1] = (anonymous_namespace)::operatorToken;
  puVar6[2] = ":";
  puVar6[3] = (anonymous_namespace)::identifier;
  puVar6[4] = "group";
  puVar6[5] = pPVar2;
  puVar6[7] = this;
  (this->parsers).groupDecl.parser = puVar6;
  (this->parsers).groupDecl.wrapper =
       &kj::parse::
        ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
        ::
        WrapperImplInstance<kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/parser.c++:777:7)>_>
        ::instance.super_Wrapper;
  pEVar5 = this->errorReporter;
  puVar6 = (undefined8 *)kj::Arena::allocateBytes(this_00,0xa0,8,false);
  *puVar6 = (anonymous_namespace)::identifier;
  puVar6[1] = "interface";
  puVar6[2] = (anonymous_namespace)::identifier;
  puVar6[3] = pPVar3;
  puVar6[4] = (anonymous_namespace)::rawParenthesizedList;
  puVar6[5] = (anonymous_namespace)::identifier;
  puVar6[6] = &kj::parse::endOfInput;
  puVar6[8] = pEVar5;
  puVar6[9] = (anonymous_namespace)::identifier;
  puVar6[10] = "extends";
  puVar6[0xb] = (anonymous_namespace)::rawParenthesizedList;
  puVar6[0xc] = pPVar1;
  puVar6[0xd] = &kj::parse::endOfInput;
  puVar6[0xf] = pEVar5;
  puVar6[0x11] = pPVar2;
  puVar6[0x13] = this;
  (this->parsers).interfaceDecl.parser = puVar6;
  (this->parsers).interfaceDecl.wrapper =
       &kj::parse::
        ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
        ::WrapperImplInstance<$ee0a24e6$>::instance.super_Wrapper;
  puVar6 = (undefined8 *)kj::Arena::allocateBytes(this_00,0x58,8,false);
  *puVar6 = (anonymous_namespace)::identifier;
  puVar6[1] = (anonymous_namespace)::operatorToken;
  puVar6[2] = ":";
  puVar6[3] = pPVar1;
  puVar6[4] = (anonymous_namespace)::operatorToken;
  puVar6[5] = "=";
  puVar6[6] = pPVar1;
  puVar6[8] = pPVar2;
  puVar6[10] = this;
  (this->parsers).param.parser = puVar6;
  (this->parsers).param.wrapper =
       &kj::parse::
        ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>
        ::
        WrapperImplInstance<kj::parse::TransformWithLocation_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>_>,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/parser.c++:822:7)>_>
        ::instance.super_Wrapper;
  pEVar5 = this->errorReporter;
  puVar6 = (undefined8 *)kj::Arena::allocateBytes(this_00,0x48,8,false);
  *puVar6 = (anonymous_namespace)::rawParenthesizedList;
  puVar6[1] = &(this->parsers).param;
  puVar6[2] = &kj::parse::endOfInput;
  puVar6[4] = pEVar5;
  puVar6[5] = this;
  puVar6[6] = pPVar1;
  puVar6[7] = this;
  pEVar5 = this->errorReporter;
  puVar7 = (undefined8 *)kj::Arena::allocateBytes(this_00,0x78,8,false);
  *puVar7 = (anonymous_namespace)::identifier;
  puVar7[1] = pPVar4;
  puVar7[2] = (anonymous_namespace)::rawBracketedList;
  puVar7[3] = (anonymous_namespace)::identifier;
  puVar7[4] = &kj::parse::endOfInput;
  puVar7[6] = pEVar5;
  puVar7[7] = puVar6;
  puVar7[8] = (anonymous_namespace)::operatorToken;
  puVar7[9] = "->";
  puVar7[10] = puVar6;
  puVar7[0xc] = pPVar2;
  puVar7[0xe] = this;
  (this->parsers).methodDecl.parser = puVar7;
  (this->parsers).methodDecl.wrapper =
       &kj::parse::
        ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
        ::WrapperImplInstance<$8c58483c$>::instance.super_Wrapper;
  puVar6 = (undefined8 *)kj::Arena::allocateBytes(this_00,0x28,8,false);
  *puVar6 = (anonymous_namespace)::identifier;
  puVar6[1] = (anonymous_namespace)::operatorToken;
  puVar6[2] = "*";
  pEVar5 = this->errorReporter;
  puVar7 = (undefined8 *)kj::Arena::allocateBytes(this_00,0x78,8,false);
  *puVar7 = (anonymous_namespace)::identifier;
  puVar7[1] = "annotation";
  puVar7[2] = (anonymous_namespace)::identifier;
  puVar7[3] = pPVar3;
  puVar7[4] = (anonymous_namespace)::rawParenthesizedList;
  puVar7[5] = puVar6;
  puVar7[6] = &kj::parse::endOfInput;
  puVar7[8] = pEVar5;
  puVar7[9] = (anonymous_namespace)::operatorToken;
  puVar7[10] = ":";
  puVar7[0xb] = pPVar1;
  puVar7[0xc] = pPVar2;
  puVar7[0xe] = this;
  (this->parsers).annotationDecl.parser = puVar7;
  (this->parsers).annotationDecl.wrapper =
       &kj::parse::
        ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
        ::WrapperImplInstance<$eea09953$>::instance.super_Wrapper;
  plVar8 = (long *)kj::Arena::allocateBytes(this_00,0x10,8,false);
  *plVar8 = (long)pPVar3;
  plVar8[1] = (long)this;
  plVar9 = (long *)kj::Arena::allocateBytes(this_00,0x10,8,false);
  local_68.first = &(this->parsers).usingDecl;
  local_68.rest.first = &(this->parsers).constDecl;
  local_68.rest.rest.rest.first = &(this->parsers).enumDecl;
  local_68.rest.rest.rest.rest.first = &(this->parsers).structDecl;
  local_68.rest.rest.rest.rest.rest.first = &(this->parsers).interfaceDecl;
  local_68.rest.rest.first = &(this->parsers).annotationDecl;
  *plVar9 = (long)pPVar2;
  plVar9[1] = (long)this;
  pOVar10 = kj::Arena::
            allocate<kj::parse::OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::C___3>::Reader_const,capnp::compiler::Token::Reader>>_capnp__compiler__CapnpParser__DeclParserResult>_>>
                      (this_00,&local_68);
  (this->parsers).genericDecl.parser = pOVar10;
  (this->parsers).genericDecl.wrapper =
       &kj::parse::
        ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
        ::
        WrapperImplInstance<kj::parse::OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>_>
        ::instance.super_Wrapper;
  plVar11 = (long *)kj::Arena::allocateBytes(this_00,0x20,8,false);
  local_68.first = &(this->parsers).enumerantDecl;
  *plVar11 = (long)__s;
  plVar11[1] = (long)plVar8;
  plVar11[2] = (long)plVar9;
  (this->parsers).fileLevelDecl.parser = plVar11;
  (this->parsers).fileLevelDecl.wrapper =
       &kj::parse::
        ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
        ::
        WrapperImplInstance<kj::parse::OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/parser.c++:971:7)>_&,_kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/parser.c++:978:7)>_&>_>
        ::instance.super_Wrapper;
  pOVar12 = kj::Arena::
            allocate<kj::parse::OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&>,kj::parse::OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&>>
                      (this_00,(OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>
                                *)&local_68);
  local_68.rest.first = &(this->parsers).fieldDecl;
  local_68.first = &(this->parsers).unionDecl;
  local_68.rest.rest.first = &(this->parsers).groupDecl;
  (this->parsers).enumLevelDecl.parser = pOVar12;
  (this->parsers).enumLevelDecl.wrapper =
       &kj::parse::
        ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
        ::
        WrapperImplInstance<kj::parse::OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>_>
        ::instance.super_Wrapper;
  local_68.rest.rest.rest.first = &__s->genericDecl;
  pOVar13 = kj::Arena::
            allocate<kj::parse::OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::C___3>::Reader_const,capnp::compiler::Token::Reader>>_capnp__compiler__CapnpParser__DeclParserResult>_>>
                      (this_00,(OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>
                                *)&local_68);
  local_68.first = &(this->parsers).methodDecl;
  (this->parsers).structLevelDecl.parser = pOVar13;
  (this->parsers).structLevelDecl.wrapper =
       &kj::parse::
        ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
        ::
        WrapperImplInstance<kj::parse::OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>_>
        ::instance.super_Wrapper;
  local_68.rest.first = &__s->genericDecl;
  pOVar14 = kj::Arena::
            allocate<kj::parse::OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&>,kj::parse::OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&>>
                      (this_00,(OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>
                                *)&local_68);
  (this->parsers).interfaceLevelDecl.parser = pOVar14;
  (this->parsers).interfaceLevelDecl.wrapper =
       &kj::parse::
        ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
        ::
        WrapperImplInstance<kj::parse::OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>_>
        ::instance.super_Wrapper;
  return;
}

Assistant:

CapnpParser::CapnpParser(Orphanage orphanageParam, ErrorReporter& errorReporterParam)
    : orphanage(orphanageParam), errorReporter(errorReporterParam) {
  auto& tupleElement = arena.copy(p::transform(
      p::sequence(p::optional(p::sequence(identifier, op("="))), parsers.expression),
      [this](kj::Maybe<Located<Text::Reader>>&& fieldName, Orphan<Expression>&& fieldValue)
             -> Orphan<Expression::Param> {
        auto result = orphanage.newOrphan<Expression::Param>();
        auto builder = result.get();
        KJ_IF_MAYBE(fn, fieldName) {
          fn->copyTo(builder.initNamed());
        } else {
          builder.setUnnamed();
        }
        builder.adoptValue(kj::mv(fieldValue));
        return kj::mv(result);
      }));

  auto& tuple = arena.copy<Parser<Located<Orphan<List<Expression::Param>>>>>(
      arena.copy(p::transform(
        parenthesizedList(tupleElement, errorReporter),
        [this](Located<kj::Array<kj::Maybe<Orphan<Expression::Param>>>>&& elements)
               -> Located<Orphan<List<Expression::Param>>> {
          auto result = orphanage.newOrphan<List<Expression::Param>>(elements.value.size());
          auto builder = result.get();
          for (uint i: kj::indices(elements.value)) {
            KJ_IF_MAYBE(e, elements.value[i]) {
              builder.adoptWithCaveats(i, kj::mv(*e));
            } else {
              builder[i].initValue().setUnknown();
            }
          }
          return elements.rewrap(kj::mv(result));
        })));

  parsers.expression = arena.copy(p::transform(
      p::sequence(
          // Base expression.
          p::oneOf(
              p::transform(integerLiteral,
                  [this](Located<uint64_t>&& value) -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    builder.setPositiveInt(value.value);
                    value.copyLocationTo(builder);
                    return result;
                  }),
              p::transform(p::sequence(op("-"), integerLiteral),
                  [this](Located<uint64_t>&& value) -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    builder.setNegativeInt(value.value);
                    value.copyLocationTo(builder);
                    return result;
                  }),
              p::transform(floatLiteral,
                  [this](Located<double>&& value) -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    builder.setFloat(value.value);
                    value.copyLocationTo(builder);
                    return result;
                  }),
              p::transform(p::sequence(op("-"), floatLiteral),
                  [this](Located<double>&& value) -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    builder.setFloat(-value.value);
                    value.copyLocationTo(builder);
                    return result;
                  }),
              p::transformWithLocation(p::sequence(op("-"), keyword("inf")),
                  [this](kj::parse::Span<List<Token>::Reader::Iterator> location)
                      -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    builder.setFloat(-kj::inf());
                    initLocation(location, builder);
                    return result;
                  }),
              p::transform(p::oneOrMore(stringLiteral),
                  [this](kj::Array<Located<Text::Reader>>&& value) -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    builder.setString(kj::strArray(
                        KJ_MAP(part, value) { return part.value; }, ""));
                    builder.setStartByte(value.front().startByte);
                    builder.setEndByte(value.back().endByte);
                    return result;
                  }),
              p::transform(binaryLiteral,
                  [this](Located<Data::Reader>&& value) -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    builder.setBinary(value.value);
                    value.copyLocationTo(builder);
                    return result;
                  }),
              p::transform(bracketedList(parsers.expression, errorReporter),
                  [this](Located<kj::Array<kj::Maybe<Orphan<Expression>>>>&& value)
                      -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    auto listBuilder = builder.initList(value.value.size());
                    for (uint i = 0; i < value.value.size(); i++) {
                      KJ_IF_MAYBE(element, value.value[i]) {
                        listBuilder.adoptWithCaveats(i, kj::mv(*element));
                      }
                    }
                    value.copyLocationTo(builder);
                    return result;
                  }),
              p::transform(tuple,
                  [this](Located<Orphan<List<Expression::Param>>>&& value)
                      -> Orphan<Expression> {
                    auto elements = value.value.get();

                    if (elements.size() == 1 && elements[0].isUnnamed()) {
                      // Single-value tuple is just a value.
                      return elements[0].disownValue();
                    } else {
                      auto result = orphanage.newOrphan<Expression>();
                      auto builder = result.get();
                      builder.adoptTuple(kj::mv(value.value));
                      value.copyLocationTo(builder);
                      return result;
                    }
                  }),
              p::transformWithLocation(p::sequence(keyword("import"), stringLiteral),
                  [this](kj::parse::Span<List<Token>::Reader::Iterator> location,
                         Located<Text::Reader>&& filename) -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    initLocation(location, builder);
                    filename.copyTo(builder.initImport());
                    return result;
                  }),
              p::transformWithLocation(p::sequence(keyword("embed"), stringLiteral),
                  [this](kj::parse::Span<List<Token>::Reader::Iterator> location,
                         Located<Text::Reader>&& filename) -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    initLocation(location, builder);
                    filename.copyTo(builder.initEmbed());
                    return result;
                  }),
              p::transformWithLocation(p::sequence(op("."), identifier),
                  [this](kj::parse::Span<List<Token>::Reader::Iterator> location,
                         Located<Text::Reader>&& name) -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    initLocation(location, builder);
                    name.copyTo(builder.initAbsoluteName());
                    return result;
                  }),
              p::transform(identifier,
                  [this](Located<Text::Reader>&& name) -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    name.copyTo(builder.initRelativeName());
                    name.copyLocationTo(builder);
                    return result;
                  })),
          // Suffixes, e.g. ".member" or "(param1, param2)".
          p::many(p::oneOf(
              p::transformWithLocation(p::sequence(op("."), identifier),
                  [this](kj::parse::Span<List<Token>::Reader::Iterator> location,
                         Located<Text::Reader>&& name) -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    initLocation(location, builder);
                    name.copyTo(builder.initMember().initName());
                    return result;
                  }),
              p::transform(tuple,
                  [this](Located<Orphan<List<Expression::Param>>>&& params) -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    params.copyLocationTo(builder);
                    builder.initApplication().adoptParams(kj::mv(params.value));
                    return result;
                  })))),
      [](Orphan<Expression>&& base, kj::Array<Orphan<Expression>>&& suffixes)
          -> Orphan<Expression> {
        // Apply all the suffixes to the base expression.
        uint startByte = base.getReader().getStartByte();
        for (auto& suffix: suffixes) {
          auto builder = suffix.get();
          if (builder.isApplication()) {
            builder.getApplication().adoptFunction(kj::mv(base));
          } else if (builder.isMember()) {
            builder.getMember().adoptParent(kj::mv(base));
          } else {
            KJ_FAIL_ASSERT("Unknown suffix?", (uint)builder.which());
          }
          builder.setStartByte(startByte);
          base = kj::mv(suffix);
        }
        return kj::mv(base);
      }));

  parsers.annotation = arena.copy(p::transform(
      p::sequence(op("$"), parsers.expression),
      [this](Orphan<Expression>&& expression)
          -> Orphan<Declaration::AnnotationApplication> {
        auto result = orphanage.newOrphan<Declaration::AnnotationApplication>();
        auto builder = result.get();

        auto exp = expression.get();
        if (exp.isApplication()) {
          // Oops, this annotation specifies the value, but we parsed it as an application on
          // the preceding expression. Pull it back apart.
          auto app = exp.getApplication();
          builder.adoptName(app.disownFunction());
          auto params = app.getParams();
          if (params.size() == 1 && params[0].isUnnamed()) {
            // Params has a single unnamed element, so reduce it to a simple value rather than
            // a tuple.
            builder.getValue().adoptExpression(params[0].disownValue());
          } else {
            // Params is not a single unnamed element, so it's a tuple.
            builder.getValue().initExpression().adoptTuple(app.disownParams());
          }
        } else {
          // The annotation has no value.
          builder.adoptName(kj::mv(expression));
          builder.getValue().setNone();
        }

        return result;
      }));

  parsers.uid = arena.copy(p::transform(
      p::sequence(op("@"), integerLiteral),
      [this](Located<uint64_t>&& value) {
        if (value.value < (1ull << 63)) {
          errorReporter.addError(value.startByte, value.endByte,
              "Invalid ID.  Please generate a new one with 'capnpc -i'.");
        }
        return value.asProto<LocatedInteger>(orphanage);
      }));

  parsers.ordinal = arena.copy(p::transform(
      p::sequence(op("@"), integerLiteral),
      [this](Located<uint64_t>&& value) {
        if (value.value >= 65536) {
          errorReporter.addError(value.startByte, value.endByte,
              "Ordinals cannot be greater than 65535.");
        }
        return value.asProto<LocatedInteger>(orphanage);
      }));

  // -----------------------------------------------------------------

  parsers.usingDecl = arena.copy(p::transform(
      p::sequence(keyword("using"), p::optional(p::sequence(identifier, op("="))),
                  parsers.expression),
      [this](kj::Maybe<Located<Text::Reader>>&& name, Orphan<Expression>&& target)
          -> DeclParserResult {
        auto decl = orphanage.newOrphan<Declaration>();
        auto builder = decl.get();
        KJ_IF_MAYBE(n, name) {
          n->copyTo(builder.initName());
        } else {
          auto targetReader = target.getReader();
          if (targetReader.isMember()) {
            builder.setName(targetReader.getMember().getName());
          } else {
            errorReporter.addErrorOn(targetReader,
                "'using' declaration without '=' must specify a named declaration from a "
                "different scope.");
          }
        }
        // no id, no annotations for using decl
        builder.initUsing().adoptTarget(kj::mv(target));
        return DeclParserResult(kj::mv(decl));
      }